

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::traverseField
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *field,QPDFObjectHandle *parent,
          int depth,set *visited)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *this_00;
  mapped_type *this_01;
  iterator iVar6;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *this_02;
  mapped_type *pmVar7;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_03;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *peVar9;
  QPDFObjectHandle our_field;
  QPDFFormFieldObjectHelper foh;
  Array a;
  string old_name;
  QPDFObjGen og;
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  string local_118;
  QPDFFormFieldObjectHelper local_f8;
  Array local_c0;
  set *local_a8;
  string local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *local_80;
  QPDFObjGen local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (depth < 0x65) {
    local_a8 = visited;
    bVar1 = QPDFObjectHandle::isIndirect(field);
    if (bVar1) {
      bVar1 = QPDFObjectHandle::isDictionary(field);
      if (bVar1) {
        local_78 = QPDFObjectHandle::getObjGen(field);
        bVar1 = QPDFObjGen::set::add(local_a8,local_78);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"/Kids",(allocator<char> *)&local_a0);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_118,(string *)field);
          QPDFObjectHandle::as_array(&local_c0,(QPDFObjectHandle *)&local_118,strict);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118._M_string_length);
          std::__cxx11::string::~string((string *)&local_f8);
          local_80 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)parent;
          if (local_c0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,"/Parent",(allocator<char> *)&local_118);
            bVar1 = QPDFObjectHandle::hasKey(field,(string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,"/Subtype",&local_119);
            bVar2 = QPDFObjectHandle::hasKey(field,(string *)&local_f8);
            bVar3 = true;
            if (!bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_118,"/Rect",&local_11a);
              bVar2 = QPDFObjectHandle::hasKey(field,&local_118);
              bVar3 = true;
              if (!bVar2) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a0,"/AP",&local_11b);
                bVar3 = QPDFObjectHandle::hasKey(field,&local_a0);
                std::__cxx11::string::~string((string *)&local_a0);
              }
              std::__cxx11::string::~string((string *)&local_118);
            }
            bVar1 = depth == 0 || bVar1;
            std::__cxx11::string::~string((string *)&local_f8);
          }
          else {
            iVar4 = ::qpdf::Array::begin(&local_c0);
            iVar5 = ::qpdf::Array::end(&local_c0);
            for (; iVar4._M_current != iVar5._M_current;
                iVar4._M_current =
                     (QPDFObjectHandle *)
                     ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar4._M_current + 1))
            {
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_40,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar4._M_current);
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)field);
              traverseField(this,(QPDFObjectHandle *)&local_40,(QPDFObjectHandle *)&local_50,
                            depth + 1,local_a8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_50._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_40._M_refcount);
            }
            bVar1 = true;
            bVar3 = false;
          }
          ::qpdf::Array::~Array(&local_c0);
          if (bVar3 != false) {
            p_Var8 = local_80;
            if (bVar1) {
              p_Var8 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)field;
            }
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_118,p_Var8);
            peVar9 = (this->m).
                     super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            local_f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                 (_func_int **)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_118);
            this_00 = (vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>
                       *)std::
                         map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
                         ::operator[](&peVar9->field_to_annotations,(key_type *)&local_f8);
            std::vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>::
            emplace_back<QPDFObjectHandle&>(this_00,field);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_118)
            ;
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                      (&local_f8,(QPDFObjectHandle *)&local_60);
            this_01 = std::
                      map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
                      ::operator[](&((this->m).
                                     super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->annotation_to_field,&local_78);
            QPDFFormFieldObjectHelper::operator=(this_01,&local_f8);
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_f8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118._M_string_length);
          }
          if (!bVar1) {
            return;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"/T",(allocator<char> *)&local_118);
          bVar1 = QPDFObjectHandle::hasKey(field,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          if (!bVar1) {
            return;
          }
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)field);
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                    (&local_f8,(QPDFObjectHandle *)&local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
          local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)QPDFObjectHandle::getObjGen(field);
          QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_(&local_118,&local_f8);
          iVar6 = std::
                  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&(((this->m).
                            super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->field_to_name)._M_t,(key_type *)&local_c0);
          peVar9 = (this->m).
                   super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if ((_Rb_tree_header *)iVar6._M_node !=
              &(peVar9->field_to_name)._M_t._M_impl.super__Rb_tree_header) {
            std::__cxx11::string::string((string *)&local_a0,(string *)&iVar6._M_node[1]._M_parent);
            this_02 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                       ::operator[](&((this->m).
                                      super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->name_to_fields,&local_a0)->_M_t;
            std::
            _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
            ::erase(this_02,(key_type *)&local_c0);
            std::__cxx11::string::~string((string *)&local_a0);
            peVar9 = (this->m).
                     super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
          }
          pmVar7 = std::
                   map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar9->field_to_name,(key_type *)&local_c0);
          std::__cxx11::string::_M_assign((string *)pmVar7);
          this_03 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                       ::operator[](&((this->m).
                                      super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->name_to_fields,&local_118);
          std::
          _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
          ::_M_insert_unique<QPDFObjGen_const&>(this_03,(QPDFObjGen *)&local_c0);
          std::__cxx11::string::~string((string *)&local_118);
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_f8);
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"loop detected while traversing /AcroForm",
                   (allocator<char> *)&local_118);
        QPDFObjectHandle::warnIfPossible(field,(string *)&local_f8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,
                   "encountered a non-dictionary as a field or annotation while traversing /AcroForm; ignoring field or annotation"
                   ,(allocator<char> *)&local_118);
        QPDFObjectHandle::warnIfPossible(field,(string *)&local_f8);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,
                 "encountered a direct object as a field or annotation while traversing /AcroForm; ignoring field or annotation"
                 ,(allocator<char> *)&local_118);
      QPDFObjectHandle::warnIfPossible(field,(string *)&local_f8);
    }
    std::__cxx11::string::~string((string *)&local_f8);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::traverseField(
    QPDFObjectHandle field, QPDFObjectHandle parent, int depth, QPDFObjGen::set& visited)
{
    if (depth > 100) {
        // Arbitrarily cut off recursion at a fixed depth to avoid specially crafted files that
        // could cause stack overflow.
        return;
    }
    if (!field.isIndirect()) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper direct field");
        field.warnIfPossible(
            "encountered a direct object as a field or annotation while "
            "traversing /AcroForm; ignoring field or annotation");
        return;
    }
    if (!field.isDictionary()) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper non-dictionary field");
        field.warnIfPossible(
            "encountered a non-dictionary as a field or annotation while"
            " traversing /AcroForm; ignoring field or annotation");
        return;
    }
    QPDFObjGen og(field.getObjGen());
    if (!visited.add(og)) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper loop");
        field.warnIfPossible("loop detected while traversing /AcroForm");
        return;
    }

    // A dictionary encountered while traversing the /AcroForm field may be a form field, an
    // annotation, or the merger of the two. A field that has no fields below it is a terminal. If a
    // terminal field looks like an annotation, it is an annotation because annotation dictionary
    // fields can be merged with terminal field dictionaries. Otherwise, the annotation fields might
    // be there to be inherited by annotations below it.

    bool is_annotation = false;
    bool is_field = (0 == depth);
    if (auto a = field.getKey("/Kids").as_array(strict)) {
        is_field = true;
        for (auto const& item: a) {
            traverseField(item, field, 1 + depth, visited);
        }
    } else {
        if (field.hasKey("/Parent")) {
            is_field = true;
        }
        if (field.hasKey("/Subtype") || field.hasKey("/Rect") || field.hasKey("/AP")) {
            is_annotation = true;
        }
    }

    QTC::TC("qpdf", "QPDFAcroFormDocumentHelper field found", (depth == 0) ? 0 : 1);
    QTC::TC("qpdf", "QPDFAcroFormDocumentHelper annotation found", (is_field ? 0 : 1));

    if (is_annotation) {
        QPDFObjectHandle our_field = (is_field ? field : parent);
        m->field_to_annotations[our_field.getObjGen()].emplace_back(field);
        m->annotation_to_field[og] = QPDFFormFieldObjectHelper(our_field);
    }

    if (is_field && (field.hasKey("/T"))) {
        QPDFFormFieldObjectHelper foh(field);
        auto f_og = field.getObjGen();
        std::string name = foh.getFullyQualifiedName();
        auto old = m->field_to_name.find(f_og);
        if (old != m->field_to_name.end()) {
            // We might be updating after a name change, so remove any old information
            std::string old_name = old->second;
            m->name_to_fields[old_name].erase(f_og);
        }
        m->field_to_name[f_og] = name;
        m->name_to_fields[name].insert(f_og);
    }
}